

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O2

void __thiscall
Eigen::internal::
gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
::operator()(gemm_pack_rhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_4,_1,_false,_false>
             *this,double *blockB,const_blas_data_mapper<double,_long,_1> *rhs,long depth,long cols,
            long stride,long offset)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  bool bVar9;
  
  if (stride == 0 && offset == 0) {
    lVar2 = cols / 4;
    lVar3 = lVar2 * 4;
    lVar4 = 0;
    if (depth < 1) {
      depth = lVar4;
    }
    lVar5 = 0x18;
    for (lVar6 = 0; SBORROW8(lVar6,lVar3) != lVar6 + lVar2 * -4 < 0; lVar6 = lVar6 + 4) {
      lVar1 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
      pdVar7 = (double *)
               ((long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data + lVar5);
      lVar8 = depth;
      while (bVar9 = lVar8 != 0, lVar8 = lVar8 + -1, bVar9) {
        blockB[lVar4] = pdVar7[-3];
        blockB[lVar4 + 1] = pdVar7[-2];
        blockB[lVar4 + 2] = pdVar7[-1];
        blockB[lVar4 + 3] = *pdVar7;
        lVar4 = lVar4 + 4;
        pdVar7 = pdVar7 + lVar1;
      }
      lVar5 = lVar5 + 0x20;
    }
    lVar2 = lVar2 << 5;
    for (; lVar3 < cols; lVar3 = lVar3 + 1) {
      lVar5 = (rhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_stride;
      pdVar7 = (double *)
               ((long)(rhs->super_blas_data_mapper<const_double,_long,_1,_0>).m_data + lVar2);
      lVar6 = depth;
      while (bVar9 = lVar6 != 0, lVar6 = lVar6 + -1, bVar9) {
        blockB[lVar4] = *pdVar7;
        lVar4 = lVar4 + 1;
        pdVar7 = pdVar7 + lVar5;
      }
      lVar2 = lVar2 + 8;
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x7f5,
                "void Eigen::internal::gemm_pack_rhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 1>, 4, 1>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 1>, nr = 4, StorageOrder = 1, Conjugate = false, PanelMode = false]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_rhs<Scalar, Index, DataMapper, nr, RowMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockB, const DataMapper& rhs, Index depth, Index cols, Index stride, Index offset)
{
  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK RHS ROWMAJOR");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index packet_cols8 = nr>=8 ? (cols/8) * 8 : 0;
  Index packet_cols4 = nr>=4 ? (cols/4) * 4 : 0;
  Index count = 0;

//   if(nr>=8)
//   {
//     for(Index j2=0; j2<packet_cols8; j2+=8)
//     {
//       // skip what we have before
//       if(PanelMode) count += 8 * offset;
//       for(Index k=0; k<depth; k++)
//       {
//         if (PacketSize==8) {
//           Packet A = ploadu<Packet>(&rhs[k*rhsStride + j2]);
//           pstoreu(blockB+count, cj.pconj(A));
//         } else if (PacketSize==4) {
//           Packet A = ploadu<Packet>(&rhs[k*rhsStride + j2]);
//           Packet B = ploadu<Packet>(&rhs[k*rhsStride + j2 + PacketSize]);
//           pstoreu(blockB+count, cj.pconj(A));
//           pstoreu(blockB+count+PacketSize, cj.pconj(B));
//         } else {
//           const Scalar* b0 = &rhs[k*rhsStride + j2];
//           blockB[count+0] = cj(b0[0]);
//           blockB[count+1] = cj(b0[1]);
//           blockB[count+2] = cj(b0[2]);
//           blockB[count+3] = cj(b0[3]);
//           blockB[count+4] = cj(b0[4]);
//           blockB[count+5] = cj(b0[5]);
//           blockB[count+6] = cj(b0[6]);
//           blockB[count+7] = cj(b0[7]);
//         }
//         count += 8;
//       }
//       // skip what we have after
//       if(PanelMode) count += 8 * (stride-offset-depth);
//     }
//   }
  if(nr>=4)
  {
    for(Index j2=packet_cols8; j2<packet_cols4; j2+=4)
    {
      // skip what we have before
      if(PanelMode) count += 4 * offset;
      for(Index k=0; k<depth; k++)
      {
        if (PacketSize==4) {
          Packet A = rhs.loadPacket(k, j2);
          pstoreu(blockB+count, cj.pconj(A));
          count += PacketSize;
        } else {
          const LinearMapper dm0 = rhs.getLinearMapper(k, j2);
          blockB[count+0] = cj(dm0(0));
          blockB[count+1] = cj(dm0(1));
          blockB[count+2] = cj(dm0(2));
          blockB[count+3] = cj(dm0(3));
          count += 4;
        }
      }
      // skip what we have after
      if(PanelMode) count += 4 * (stride-offset-depth);
    }
  }
  // copy the remaining columns one at a time (nr==1)
  for(Index j2=packet_cols4; j2<cols; ++j2)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
    {
      blockB[count] = cj(rhs(k, j2));
      count += 1;
    }
    if(PanelMode) count += stride-offset-depth;
  }
}